

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O0

void __thiscall
OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
request_edge_colors(AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    *this)

{
  uint uVar1;
  allocator local_31;
  string local_30 [32];
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *local_10;
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_local;
  
  uVar1 = this->refcount_ecolors_;
  this->refcount_ecolors_ = uVar1 + 1;
  if (uVar1 == 0) {
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"e:colors",&local_31);
    BaseKernel::add_property<OpenMesh::VectorT<unsigned_char,3>>
              ((BaseKernel *)this,&this->edge_colors_,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void request_edge_colors()
  {
    if (!refcount_ecolors_++)
      this->add_property( edge_colors_, "e:colors" );
  }